

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_6x6(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  JSAMPROW pJVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int aiStack_c8 [6];
  int aiStack_b0 [6];
  undefined4 auStack_98 [6];
  undefined4 auStack_80 [6];
  int aiStack_68 [6];
  undefined4 auStack_50 [8];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  for (lVar11 = 0; (int)lVar11 != 6; lVar11 = lVar11 + 1) {
    lVar14 = (long)*(int *)((long)pvVar5 + lVar11 * 4) * (long)coef_block[lVar11] * 0x2000;
    lVar17 = (long)*(int *)((long)pvVar5 + lVar11 * 4 + 0x80) * (long)coef_block[lVar11 + 0x20];
    lVar13 = lVar17 * 0x16a1 + lVar14 + 0x400;
    lVar9 = (long)*(int *)((long)pvVar5 + lVar11 * 4 + 0x40) * (long)coef_block[lVar11 + 0x10];
    lVar1 = lVar9 * 0x2731 + lVar13;
    lVar13 = lVar13 + lVar9 * -0x2731;
    lVar18 = (long)*(int *)((long)pvVar5 + lVar11 * 4 + 0x20) * (long)coef_block[lVar11 + 8];
    lVar22 = (long)*(int *)((long)pvVar5 + lVar11 * 4 + 0x60) * (long)coef_block[lVar11 + 0x18];
    lVar19 = (long)*(int *)((long)pvVar5 + lVar11 * 4 + 0xa0) * (long)coef_block[lVar11 + 0x28];
    lVar21 = (lVar19 + lVar18) * 0xbb6;
    lVar9 = (lVar22 + lVar18) * 0x2000 + lVar21;
    lVar21 = (lVar19 - lVar22) * 0x2000 + lVar21;
    iVar15 = (int)lVar18 - ((int)lVar22 + (int)lVar19);
    aiStack_c8[lVar11] = (int)((ulong)(lVar1 + lVar9) >> 0xb);
    auStack_50[lVar11] = (int)((ulong)(lVar1 - lVar9) >> 0xb);
    iVar7 = (int)(lVar14 + lVar17 * -0x2d42 + 0x400U >> 0xb);
    aiStack_c8[lVar11 + 6] = iVar7 + iVar15 * 4;
    aiStack_68[lVar11] = iVar7 + iVar15 * -4;
    auStack_98[lVar11] = (int)((ulong)(lVar21 + lVar13) >> 0xb);
    auStack_80[lVar11] = (int)((ulong)(lVar13 - lVar21) >> 0xb);
  }
  uVar8 = (ulong)output_col;
  for (lVar11 = 0; lVar11 != 0x12; lVar11 = lVar11 + 3) {
    pJVar6 = *output_buf;
    iVar15 = aiStack_c8[lVar11 * 2 + 1];
    iVar12 = aiStack_c8[lVar11 * 2 + 4] * 0x16a1 + aiStack_c8[lVar11 * 2] * 0x2000 + 0x20000;
    iVar16 = aiStack_c8[lVar11 * 2] * 0x2000 + aiStack_c8[lVar11 * 2 + 4] * -0x2d42 + 0x20000;
    iVar7 = iVar12 + aiStack_c8[lVar11 * 2 + 2] * 0x2731;
    iVar12 = iVar12 + aiStack_c8[lVar11 * 2 + 2] * -0x2731;
    iVar2 = aiStack_c8[lVar11 * 2 + 3];
    iVar3 = aiStack_c8[lVar11 * 2 + 5];
    iVar10 = (iVar3 + iVar15) * 0xbb6;
    iVar20 = (iVar2 + iVar15) * 0x2000 + iVar10;
    iVar10 = (iVar3 - iVar2) * 0x2000 + iVar10;
    iVar15 = iVar15 - (iVar2 + iVar3);
    pJVar6[uVar8] = pJVar4[(ulong)((uint)(iVar7 + iVar20) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar8 + 5] = pJVar4[(ulong)((uint)(iVar7 - iVar20) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar8 + 1] = pJVar4[(ulong)((uint)(iVar15 * 0x2000 + iVar16) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar8 + 4] = pJVar4[(ulong)((uint)(iVar16 + iVar15 * -0x2000) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar8 + 2] = pJVar4[(ulong)((uint)(iVar10 + iVar12) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar8 + 3] = pJVar4[(ulong)((uint)(iVar12 - iVar10) >> 0x12 & 0x3ff) + 0x80];
    output_buf = output_buf + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_6x6 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JCOEFPTR coef_block,
	       JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp10, tmp11, tmp12;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[6*6];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 6; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp0 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-1);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp10 = MULTIPLY(tmp2, FIX(0.707106781));   /* c4 */
    tmp1 = tmp0 + tmp10;
    tmp11 = RIGHT_SHIFT(tmp0 - tmp10 - tmp10, CONST_BITS-PASS1_BITS);
    tmp10 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    tmp0 = MULTIPLY(tmp10, FIX(1.224744871));   /* c2 */
    tmp10 = tmp1 + tmp0;
    tmp12 = tmp1 - tmp0;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp1 = MULTIPLY(z1 + z3, FIX(0.366025404)); /* c5 */
    tmp0 = tmp1 + ((z1 + z2) << CONST_BITS);
    tmp2 = tmp1 + ((z3 - z2) << CONST_BITS);
    tmp1 = (z1 - z2 - z3) << PASS1_BITS;

    /* Final output stage */

    wsptr[6*0] = (int) RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[6*5] = (int) RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS-PASS1_BITS);
    wsptr[6*1] = (int) (tmp11 + tmp1);
    wsptr[6*4] = (int) (tmp11 - tmp1);
    wsptr[6*2] = (int) RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[6*3] = (int) RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS-PASS1_BITS);
  }

  /* Pass 2: process 6 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 6; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp0 <<= CONST_BITS;
    tmp2 = (INT32) wsptr[4];
    tmp10 = MULTIPLY(tmp2, FIX(0.707106781));   /* c4 */
    tmp1 = tmp0 + tmp10;
    tmp11 = tmp0 - tmp10 - tmp10;
    tmp10 = (INT32) wsptr[2];
    tmp0 = MULTIPLY(tmp10, FIX(1.224744871));   /* c2 */
    tmp10 = tmp1 + tmp0;
    tmp12 = tmp1 - tmp0;

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z3 = (INT32) wsptr[5];
    tmp1 = MULTIPLY(z1 + z3, FIX(0.366025404)); /* c5 */
    tmp0 = tmp1 + ((z1 + z2) << CONST_BITS);
    tmp2 = tmp1 + ((z3 - z2) << CONST_BITS);
    tmp1 = (z1 - z2 - z3) << CONST_BITS;

    /* Final output stage */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += 6;		/* advance pointer to next row */
  }
}